

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O2

void vk::validateAllocationCallbacks
               (AllocationCallbackRecorder *recorder,AllocationCallbackValidationResults *results)

{
  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_> *this;
  void **ppvVar1;
  anon_union_40_4_36e40bc3_for_data *item;
  AllocationCallbackRecord *record;
  size_t *psVar2;
  char cVar3;
  VkSystemAllocationScope VVar4;
  ulong uVar5;
  void *pvVar6;
  mapped_type_conflict1 mVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  undefined4 uVar12;
  bool bVar13;
  VkSystemAllocationScope *pVVar14;
  size_t sVar15;
  mapped_type_conflict1 *pmVar16;
  ulong uVar17;
  pointer pAVar18;
  Type TVar19;
  Block *pBVar20;
  ulong uVar21;
  pointer pAVar22;
  value_type local_d8;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  allocations;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ptrToSlotIndex;
  
  allocations.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header;
  ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  allocations.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allocations.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar5 = (recorder->m_records).m_blockSize;
  pBVar20 = (recorder->m_records).m_first;
  this = &results->violations;
  uVar21 = 0;
  uVar17 = uVar5;
  ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pAVar18 = allocations.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((pBVar20 == (recorder->m_records).m_last) &&
       (pAVar22 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       uVar21 == (recorder->m_records).m_numElements % uVar17)) {
      for (; pAVar22 != pAVar18; pAVar22 = pAVar22 + 1) {
        if (pAVar22->isLive == true) {
          std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>::
          push_back(&results->liveAllocations,&pAVar22->record);
        }
      }
      std::
      _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::~_Rb_tree(&ptrToSlotIndex._M_t);
      std::
      vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
      ::~vector(&allocations);
      return;
    }
    record = pBVar20->elements + uVar21;
    TVar19 = pBVar20->elements[uVar21].type;
    if (TVar19 == TYPE_INTERNAL_ALLOCATION) {
LAB_008a8cfe:
      pVVar14 = &(record->data).internalAllocation.scope;
LAB_008a8d02:
      if (VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE < *pVVar14) {
        local_d8.record.type = record->type;
        local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
        local_d8.record.data.allocation.size = (record->data).allocation.size;
        local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
        local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
        local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
        local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
        local_d8.isLive = true;
        local_d8._49_3_ = 0;
        std::
        vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>::
        emplace_back<vk::AllocationCallbackViolation>(this,(AllocationCallbackViolation *)&local_d8)
        ;
        TVar19 = record->type;
      }
      if ((TVar19 < TYPE_FREE) &&
         (sVar15 = anon_unknown_13::getAlignment(record), (sVar15 & sVar15 - 1) != 0)) {
        local_d8.record.type = record->type;
        local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
        local_d8.record.data.allocation.size = (record->data).allocation.size;
        local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
        local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
        local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
        local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
        local_d8.isLive = true;
        local_d8._49_3_ = 0;
        std::
        vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>::
        emplace_back<vk::AllocationCallbackViolation>(this,(AllocationCallbackViolation *)&local_d8)
        ;
        TVar19 = record->type;
      }
    }
    else {
      if (TVar19 == TYPE_REALLOCATION) {
        pVVar14 = &(record->data).reallocation.scope;
        goto LAB_008a8d02;
      }
      if (TVar19 == TYPE_ALLOCATION) {
        pVVar14 = &(record->data).allocation.scope;
        goto LAB_008a8d02;
      }
      if (TVar19 == TYPE_INTERNAL_FREE) goto LAB_008a8cfe;
    }
    switch(TVar19) {
    case TYPE_ALLOCATION:
      if ((record->data).allocation.returnedPtr != (void *)0x0) {
        ppvVar1 = &(record->data).allocation.returnedPtr;
        bVar13 = de::
                 contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                           (&ptrToSlotIndex,ppvVar1);
        pAVar22 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar18 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (bVar13) {
          pmVar16 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[](&ptrToSlotIndex,ppvVar1);
          mVar7 = *pmVar16;
          cVar3 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start[mVar7].isLive;
          pAVar18 = allocations.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start;
joined_r0x008a8f9e:
          if (cVar3 == '\0') {
            pAVar18 = pAVar18 + mVar7;
            pAVar18->isLive = true;
            uVar12 = *(undefined4 *)&record->field_0x4;
            sVar15 = (record->data).allocation.size;
            sVar9 = (record->data).allocation.alignment;
            sVar10 = (record->data).reallocation.alignment;
            pvVar6 = (record->data).allocation.returnedPtr;
            pvVar11 = (record->data).reallocation.returnedPtr;
            (pAVar18->record).type = record->type;
            *(undefined4 *)&(pAVar18->record).field_0x4 = uVar12;
            (pAVar18->record).data.allocation.size = sVar15;
            (pAVar18->record).data.allocation.alignment = sVar9;
            (pAVar18->record).data.reallocation.alignment = sVar10;
            (pAVar18->record).data.allocation.returnedPtr = pvVar6;
            (pAVar18->record).data.reallocation.returnedPtr = pvVar11;
          }
        }
        else {
          pmVar16 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[](&ptrToSlotIndex,ppvVar1);
          *pmVar16 = ((long)pAVar22 - (long)pAVar18) / 0x38;
          local_d8.record.type = record->type;
          local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
          local_d8.record.data.allocation.size = (record->data).allocation.size;
          local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          std::
          vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
          ::push_back(&allocations,&local_d8);
        }
      }
      break;
    case TYPE_REALLOCATION:
      item = &record->data;
      bVar13 = de::
               contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                         (&ptrToSlotIndex,&(item->free).mem);
      if (bVar13) {
        pmVar16 = std::
                  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  ::operator[](&ptrToSlotIndex,&(item->free).mem);
        pAVar18 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar22 = allocations.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start + *pmVar16;
        if ((record->data).allocation.alignment == 0) {
          pAVar22->isLive = false;
        }
        else {
          sVar15 = anon_unknown_13::getAlignment(&pAVar22->record);
          if (sVar15 != (record->data).reallocation.alignment) {
            local_d8.record.type = record->type;
            local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
            local_d8.record.data.allocation.size = (record->data).allocation.size;
            local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::emplace_back<vk::AllocationCallbackViolation>
                      (this,(AllocationCallbackViolation *)&local_d8);
          }
          pvVar6 = (record->data).reallocation.returnedPtr;
          if ((void *)(record->data).allocation.size == pvVar6) {
            if (pAVar22->isLive == false) {
              local_d8.record.type = record->type;
              local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
              local_d8.record.data.allocation.size = (record->data).allocation.size;
              local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
              local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
              local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
              local_d8.record.data.reallocation.returnedPtr =
                   (record->data).reallocation.returnedPtr;
              local_d8.isLive = true;
              local_d8._49_3_ = 0;
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::emplace_back<vk::AllocationCallbackViolation>
                        (this,(AllocationCallbackViolation *)&local_d8);
              pAVar22->isLive = true;
            }
            TVar19 = record->type;
            uVar12 = *(undefined4 *)&record->field_0x4;
            sVar15 = (record->data).allocation.size;
            sVar9 = (record->data).allocation.alignment;
            sVar10 = (record->data).reallocation.alignment;
            pvVar6 = (record->data).reallocation.returnedPtr;
            (pAVar22->record).data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            (pAVar22->record).data.reallocation.returnedPtr = pvVar6;
            (pAVar22->record).data.allocation.alignment = sVar9;
            (pAVar22->record).data.reallocation.alignment = sVar10;
            (pAVar22->record).type = TVar19;
            *(undefined4 *)&(pAVar22->record).field_0x4 = uVar12;
            (pAVar22->record).data.allocation.size = sVar15;
          }
          else if (pvVar6 != (void *)0x0) {
            ppvVar1 = &(record->data).reallocation.returnedPtr;
            pAVar22->isLive = false;
            bVar13 = de::
                     contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                               (&ptrToSlotIndex,ppvVar1);
            pAVar22 = allocations.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar13) {
              pmVar16 = std::
                        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                        ::operator[](&ptrToSlotIndex,ppvVar1);
              mVar7 = *pmVar16;
              cVar3 = pAVar18[mVar7].isLive;
              goto joined_r0x008a8f9e;
            }
            pmVar16 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[](&ptrToSlotIndex,ppvVar1);
            *pmVar16 = ((long)pAVar22 - (long)pAVar18) / 0x38;
            local_d8.record.type = record->type;
            local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
            local_d8.record.data.allocation.size = (record->data).allocation.size;
            local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            std::
            vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ::push_back(&allocations,&local_d8);
          }
        }
      }
      else {
        if ((item->allocation).size != 0) {
          local_d8.record.type = record->type;
          local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
          local_d8.record.data.allocation.size = (record->data).allocation.size;
          local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::emplace_back<vk::AllocationCallbackViolation>
                    (this,(AllocationCallbackViolation *)&local_d8);
        }
        if ((record->data).reallocation.returnedPtr != (void *)0x0) {
          ppvVar1 = &(record->data).reallocation.returnedPtr;
          bVar13 = de::
                   contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                             (&ptrToSlotIndex,ppvVar1);
          pAVar22 = allocations.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pAVar18 = allocations.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar13) {
            pmVar16 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[](&ptrToSlotIndex,ppvVar1);
            mVar7 = *pmVar16;
            allocations.
            super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ._M_impl.super__Vector_impl_data._M_start[mVar7].isLive = true;
            uVar12 = *(undefined4 *)&record->field_0x4;
            sVar15 = (record->data).allocation.size;
            sVar9 = (record->data).allocation.alignment;
            sVar10 = (record->data).reallocation.alignment;
            pvVar6 = (record->data).allocation.returnedPtr;
            pvVar11 = (record->data).reallocation.returnedPtr;
            pAVar18 = allocations.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start + mVar7;
            (pAVar18->record).type = record->type;
            *(undefined4 *)&(pAVar18->record).field_0x4 = uVar12;
            (pAVar18->record).data.allocation.size = sVar15;
            psVar2 = &allocations.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start[mVar7].record.data.allocation.
                      alignment;
            *psVar2 = sVar9;
            psVar2[1] = sVar10;
            ppvVar1 = &allocations.
                       super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                       ._M_impl.super__Vector_impl_data._M_start[mVar7].record.data.allocation.
                       returnedPtr;
            *ppvVar1 = pvVar6;
            ppvVar1[1] = pvVar11;
          }
          else {
            pmVar16 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[](&ptrToSlotIndex,ppvVar1);
            *pmVar16 = ((long)pAVar22 - (long)pAVar18) / 0x38;
            local_d8.record.type = record->type;
            local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
            local_d8.record.data.allocation.size = (record->data).allocation.size;
            local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            std::
            vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ::push_back(&allocations,&local_d8);
          }
        }
      }
      break;
    case TYPE_FREE:
      if ((record->data).allocation.size != 0) {
        bVar13 = de::
                 contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                           (&ptrToSlotIndex,&(record->data).free.mem);
        if (bVar13) {
          pmVar16 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[](&ptrToSlotIndex,&(record->data).free.mem);
          if (allocations.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_start[*pmVar16].isLive == true) {
            allocations.
            super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ._M_impl.super__Vector_impl_data._M_start[*pmVar16].isLive = false;
          }
          else {
            local_d8.record.type = record->type;
            local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
            local_d8.record.data.allocation.size = (record->data).allocation.size;
            local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
            local_d8.isLive = false;
            local_d8._49_3_ = 0;
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::emplace_back<vk::AllocationCallbackViolation>
                      (this,(AllocationCallbackViolation *)&local_d8);
          }
        }
        else {
          local_d8.record.type = record->type;
          local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
          local_d8.record.data.allocation.size = (record->data).allocation.size;
          local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::emplace_back<vk::AllocationCallbackViolation>
                    (this,(AllocationCallbackViolation *)&local_d8);
        }
      }
      break;
    case TYPE_INTERNAL_ALLOCATION:
    case TYPE_INTERNAL_FREE:
      if ((record->data).internalAllocation.type == VK_INTERNAL_ALLOCATION_TYPE_EXECUTABLE) {
        VVar4 = (record->data).internalAllocation.scope;
        uVar17 = (record->data).allocation.size;
        uVar8 = results->internalAllocationTotal[0][VVar4];
        if (TVar19 == TYPE_INTERNAL_FREE) {
          if (uVar8 < uVar17) {
            local_d8.record.type = record->type;
            local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
            local_d8.record.data.allocation.size = (record->data).allocation.size;
            local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::emplace_back<vk::AllocationCallbackViolation>
                      (this,(AllocationCallbackViolation *)&local_d8);
            results->internalAllocationTotal[0][VVar4] = 0;
          }
          else {
            results->internalAllocationTotal[0][VVar4] = uVar8 - uVar17;
          }
        }
        else {
          results->internalAllocationTotal[0][VVar4] = uVar8 + uVar17;
        }
      }
      else {
        local_d8.record.type = record->type;
        local_d8.record._4_4_ = *(undefined4 *)&record->field_0x4;
        local_d8.record.data.allocation.size = (record->data).allocation.size;
        local_d8.record.data.allocation.alignment = (record->data).allocation.alignment;
        local_d8.record.data.reallocation.alignment = (record->data).reallocation.alignment;
        local_d8.record.data.allocation.returnedPtr = (record->data).allocation.returnedPtr;
        local_d8.record.data.reallocation.returnedPtr = (record->data).reallocation.returnedPtr;
        local_d8.isLive = true;
        local_d8._49_3_ = 0;
        std::
        vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>::
        emplace_back<vk::AllocationCallbackViolation>(this,(AllocationCallbackViolation *)&local_d8)
        ;
      }
    }
    uVar21 = uVar21 + 1;
    if (uVar21 == uVar5) {
      pBVar20 = pBVar20->next;
      uVar21 = 0;
    }
    uVar17 = (recorder->m_records).m_blockSize;
  } while( true );
}

Assistant:

void validateAllocationCallbacks (const AllocationCallbackRecorder& recorder, AllocationCallbackValidationResults* results)
{
	std::vector<AllocationSlot>		allocations;
	std::map<void*, size_t>			ptrToSlotIndex;

	DE_ASSERT(results->liveAllocations.empty() && results->violations.empty());

	for (AllocationCallbackRecorder::RecordIterator callbackIter = recorder.getRecordsBegin();
		 callbackIter != recorder.getRecordsEnd();
		 ++callbackIter)
	{
		const AllocationCallbackRecord&		record	= *callbackIter;

		// Validate scope
		{
			const VkSystemAllocationScope* const	scopePtr	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION			? &record.data.allocation.scope
																: record.type == AllocationCallbackRecord::TYPE_REALLOCATION		? &record.data.reallocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION	? &record.data.internalAllocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE		? &record.data.internalAllocation.scope
																: DE_NULL;

			if (scopePtr && !de::inBounds(*scopePtr, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE));
		}

		// Validate alignment
		if (record.type == AllocationCallbackRecord::TYPE_ALLOCATION ||
			record.type == AllocationCallbackRecord::TYPE_REALLOCATION)
		{
			if (!deIsPowerOfTwoSize(getAlignment(record)))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALIGNMENT));
		}

		// Validate actual allocation behavior
		switch (record.type)
		{
			case AllocationCallbackRecord::TYPE_ALLOCATION:
			{
				if (record.data.allocation.returnedPtr)
				{
					if (!de::contains(ptrToSlotIndex, record.data.allocation.returnedPtr))
					{
						ptrToSlotIndex[record.data.allocation.returnedPtr] = allocations.size();
						allocations.push_back(AllocationSlot(record, true));
					}
					else
					{
						const size_t		slotNdx		= ptrToSlotIndex[record.data.allocation.returnedPtr];
						if (!allocations[slotNdx].isLive)
						{
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
						else
						{
							// we should not have multiple live allocations with the same pointer
							DE_ASSERT(false);
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_REALLOCATION:
			{
				if (de::contains(ptrToSlotIndex, record.data.reallocation.original))
				{
					const size_t		origSlotNdx		= ptrToSlotIndex[record.data.reallocation.original];
					AllocationSlot&		origSlot		= allocations[origSlotNdx];

					DE_ASSERT(record.data.reallocation.original != DE_NULL);

					if (record.data.reallocation.size > 0)
					{
						if (getAlignment(origSlot.record) != record.data.reallocation.alignment)
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT));

						if (record.data.reallocation.original == record.data.reallocation.returnedPtr)
						{
							if (!origSlot.isLive)
							{
								results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_FREED_PTR));
								origSlot.isLive	= true; // Mark live to suppress further errors
							}

							// Just update slot record
							allocations[origSlotNdx].record = record;
						}
						else
						{
							if (record.data.reallocation.returnedPtr)
							{
								allocations[origSlotNdx].isLive = false;
								if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
								{
									ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
									allocations.push_back(AllocationSlot(record, true));
								}
								else
								{
									const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
									if (!allocations[slotNdx].isLive)
									{
										allocations[slotNdx].isLive = true;
										allocations[slotNdx].record = record;
									}
									else
									{
										// we should not have multiple live allocations with the same pointer
										DE_ASSERT(false);
									}
								}
							}
							// else original ptr remains valid and live
						}
					}
					else
					{
						DE_ASSERT(!record.data.reallocation.returnedPtr);

						origSlot.isLive = false;
					}
				}
				else
				{
					if (record.data.reallocation.original)
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR));

					if (record.data.reallocation.returnedPtr)
					{
						if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
						{
							ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
							allocations.push_back(AllocationSlot(record, true));
						}
						else
						{
							const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
							DE_ASSERT(!allocations[slotNdx].isLive);
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_FREE:
			{
				if (record.data.free.mem != DE_NULL) // Freeing null pointer is valid and ignored
				{
					if (de::contains(ptrToSlotIndex, record.data.free.mem))
					{
						const size_t	slotNdx		= ptrToSlotIndex[record.data.free.mem];

						if (allocations[slotNdx].isLive)
							allocations[slotNdx].isLive = false;
						else
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_DOUBLE_FREE));
					}
					else
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR));
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
			case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			{
				if (de::inBounds(record.data.internalAllocation.type, (VkInternalAllocationType)0, VK_INTERNAL_ALLOCATION_TYPE_LAST))
				{
					size_t* const		totalAllocSizePtr	= &results->internalAllocationTotal[record.data.internalAllocation.type][record.data.internalAllocation.scope];
					const size_t		size				= record.data.internalAllocation.size;

					if (record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE)
					{
						if (*totalAllocSizePtr < size)
						{
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL));
							*totalAllocSizePtr = 0; // Reset to 0 to suppress compound errors
						}
						else
							*totalAllocSizePtr -= size;
					}
					else
						*totalAllocSizePtr += size;
				}
				else
					results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE));

				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	DE_ASSERT(!de::contains(ptrToSlotIndex, DE_NULL));

	// Collect live allocations
	for (std::vector<AllocationSlot>::const_iterator slotIter = allocations.begin();
		 slotIter != allocations.end();
		 ++slotIter)
	{
		if (slotIter->isLive)
			results->liveAllocations.push_back(slotIter->record);
	}
}